

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O3

void __thiscall TestOutput::printFailure(TestOutput *this,TestFailure *failure)

{
  bool bVar1;
  SimpleString SStack_28;
  
  bVar1 = TestFailure::isOutsideTestFile(failure);
  if (!bVar1) {
    bVar1 = TestFailure::isInHelperFunction(failure);
    if (!bVar1) {
      printFileAndLineForFailure(this,failure);
      goto LAB_00139b99;
    }
  }
  printFileAndLineForTestAndFailure(this,failure);
LAB_00139b99:
  (*failure->_vptr_TestFailure[6])(&SStack_28,failure);
  printFailureMessage(this,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  return;
}

Assistant:

void TestOutput::printFailure(const TestFailure& failure)
{
    if (failure.isOutsideTestFile() || failure.isInHelperFunction())
        printFileAndLineForTestAndFailure(failure);
    else
        printFileAndLineForFailure(failure);

    printFailureMessage(failure.getMessage());
}